

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

M44d * Imath_3_2::procrustesRotationAndTranslation<float>
                 (M44d *__return_storage_ptr__,Vec3<float> *A,Vec3<float> *B,float *weights,
                 size_t numPoints,bool doScale)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  size_t sVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  double (*A_00) [3];
  float *pfVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  M33d C;
  M33d Qt;
  V3d S;
  M33d U;
  M33d V;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  double local_168;
  double dStack_160;
  double local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_118;
  undefined1 local_110 [16];
  double local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  Vec3<double> local_e0;
  Matrix33<double> local_c8;
  Matrix33<double> local_78;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    auVar30 = ZEXT816(0);
    if (weights == (float *)0x0) {
      lVar10 = 8;
      auVar31 = ZEXT816(0);
      auVar29 = ZEXT816(0);
      sVar12 = numPoints;
      do {
        uVar1 = *(undefined8 *)((long)A + lVar10 + -8);
        dVar28 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + (double)(float)uVar1;
        auVar31._8_8_ = dVar28 + (double)(float)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)B + lVar10 + -8);
        dVar28 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + (double)(float)uVar1;
        auVar30._8_8_ = dVar28 + (double)(float)((ulong)uVar1 >> 0x20);
        dVar28 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + (double)*(float *)((long)&B->x + lVar10);
        auVar29._8_8_ = dVar28 + (double)*(float *)((long)&A->x + lVar10);
        lVar10 = lVar10 + 0xc;
        sVar12 = sVar12 - 1;
      } while (sVar12 != 0);
      auVar20._8_4_ = (int)(numPoints >> 0x20);
      auVar20._0_8_ = numPoints;
      auVar20._12_4_ = 0x45300000;
      dVar28 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      dVar28 = 0.0;
      lVar10 = 2;
      sVar12 = 0;
      auVar31 = ZEXT816(0);
      auVar29 = ZEXT816(0);
      do {
        dVar19 = (double)weights[sVar12];
        dVar28 = dVar28 + dVar19;
        uVar1 = *(undefined8 *)((long)A + lVar10 * 4 + -8);
        dVar27 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + (double)(float)uVar1 * dVar19;
        auVar31._8_8_ = dVar27 + (double)(float)((ulong)uVar1 >> 0x20) * dVar19;
        uVar1 = *(undefined8 *)((long)B + lVar10 * 4 + -8);
        dVar27 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + (double)(float)uVar1 * dVar19;
        auVar30._8_8_ = dVar27 + (double)(float)((ulong)uVar1 >> 0x20) * dVar19;
        dVar27 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + (double)(&B->x)[lVar10] * dVar19;
        auVar29._8_8_ = dVar27 + (double)(&A->x)[lVar10] * dVar19;
        sVar12 = sVar12 + 1;
        lVar10 = lVar10 + 3;
      } while (numPoints != sVar12);
    }
    uVar18 = (undefined4)((ulong)dVar28 >> 0x20);
    uVar17 = SUB84(dVar28,0);
    if ((dVar28 != 0.0) || (NAN(dVar28))) {
      lVar10 = numPoints + (numPoints == 0);
      auVar2._8_4_ = uVar17;
      auVar2._0_8_ = dVar28;
      auVar2._12_4_ = uVar18;
      local_148 = divpd(auVar31,auVar2);
      auVar3._8_4_ = uVar17;
      auVar3._0_8_ = dVar28;
      auVar3._12_4_ = uVar18;
      local_138 = divpd(auVar30,auVar3);
      auVar4._8_4_ = uVar17;
      auVar4._0_8_ = dVar28;
      auVar4._12_4_ = uVar18;
      auVar30 = divpd(auVar29,auVar4);
      dVar28 = 0.0;
      dVar19 = 0.0;
      local_188._0_8_ = 0.0;
      local_188._8_8_ = 0.0;
      local_178._0_8_ = 0.0;
      local_178._8_8_ = 0.0;
      local_168 = 0.0;
      dStack_160 = 0.0;
      local_158 = 0.0;
      dVar32 = auVar30._8_8_;
      dVar27 = auVar30._0_8_;
      if (weights == (float *)0x0) {
        lVar13 = 8;
        dVar28 = 0.0;
        dVar19 = 0.0;
        do {
          uVar1 = *(undefined8 *)((long)A + lVar13 + -8);
          dVar23 = (double)*(float *)((long)&B->x + lVar13) - dVar27;
          dVar26 = (double)*(float *)((long)&A->x + lVar13) - dVar32;
          dVar21 = (double)(float)uVar1 - local_148._0_8_;
          dVar22 = (double)(float)((ulong)uVar1 >> 0x20) - local_148._8_8_;
          uVar1 = *(undefined8 *)((long)B + lVar13 + -8);
          dVar25 = (double)(float)uVar1 - local_138._0_8_;
          dVar24 = (double)(float)((ulong)uVar1 >> 0x20) - local_138._8_8_;
          dVar28 = dVar28 + dVar25 * dVar21;
          dVar19 = dVar19 + dVar25 * dVar22;
          local_188._0_8_ = (double)local_188._0_8_ + dVar26 * dVar25;
          local_188._8_8_ = (double)local_188._8_8_ + dVar21 * dVar24;
          local_178._0_8_ = (double)local_178._0_8_ + dVar22 * dVar24;
          local_178._8_8_ = (double)local_178._8_8_ + dVar26 * dVar24;
          local_168 = local_168 + dVar23 * dVar21;
          dStack_160 = dStack_160 + dVar23 * dVar22;
          local_158 = local_158 + dVar26 * dVar23;
          lVar13 = lVar13 + 0xc;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      else {
        lVar13 = 2;
        lVar15 = 0;
        do {
          dVar25 = (double)weights[lVar15];
          dVar21 = ((double)(&B->x)[lVar13] - dVar27) * dVar25;
          dVar22 = (double)(&A->x)[lVar13] - dVar32;
          uVar1 = *(undefined8 *)((long)A + lVar13 * 4 + -8);
          dVar23 = (double)(float)uVar1 - local_148._0_8_;
          dVar26 = (double)(float)((ulong)uVar1 >> 0x20) - local_148._8_8_;
          uVar1 = *(undefined8 *)((long)B + lVar13 * 4 + -8);
          dVar24 = dVar25 * ((double)(float)uVar1 - local_138._0_8_);
          dVar25 = dVar25 * ((double)(float)((ulong)uVar1 >> 0x20) - local_138._8_8_);
          dVar28 = dVar28 + dVar24 * dVar23;
          dVar19 = dVar19 + dVar24 * dVar26;
          local_188._0_8_ = (double)local_188._0_8_ + dVar22 * dVar24;
          local_188._8_8_ = (double)local_188._8_8_ + dVar23 * dVar25;
          local_178._0_8_ = (double)local_178._0_8_ + dVar26 * dVar25;
          local_178._8_8_ = (double)local_178._8_8_ + dVar22 * dVar25;
          local_168 = local_168 + dVar21 * dVar23;
          dStack_160 = dStack_160 + dVar21 * dVar26;
          local_158 = local_158 + dVar22 * dVar21;
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 3;
        } while (lVar10 != lVar15);
      }
      uVar9 = (ulong)local_178._8_8_ >> 0x20;
      uVar8 = (ulong)local_188._8_8_ >> 0x20;
      A_00 = (double (*) [3])local_198;
      local_198._8_4_ = SUB84(dVar19,0);
      local_198._0_8_ = dVar28;
      local_198._12_4_ = (int)((ulong)dVar19 >> 0x20);
      local_188._8_4_ = (int)local_188._8_8_;
      local_188._12_4_ = (int)uVar8;
      local_178._8_4_ = (int)local_178._8_8_;
      local_178._12_4_ = (int)uVar9;
      local_c8.x[0][0] = 1.0;
      local_c8.x[0][1] = 0.0;
      local_c8.x[0][2] = 0.0;
      local_c8.x[1][0] = 0.0;
      local_c8.x[1][1] = 1.0;
      local_c8.x[1][2] = 0.0;
      local_c8.x[2][0] = 0.0;
      local_c8.x[2][1] = 0.0;
      local_c8.x[2][2] = 1.0;
      local_78.x[0][0] = 1.0;
      local_78.x[0][1] = 0.0;
      local_78.x[0][2] = 0.0;
      local_78.x[1][0] = 0.0;
      local_78.x[1][1] = 1.0;
      local_78.x[1][2] = 0.0;
      local_78.x[2][0] = 0.0;
      local_78.x[2][1] = 0.0;
      local_78.x[2][2] = 1.0;
      jacobiSVD<double>((Matrix33<double> *)A_00,&local_c8,&local_e0,&local_78,2.220446049250313e-16
                        ,true);
      local_128 = local_78.x[0][2] * local_c8.x[0][2] +
                  local_78.x[0][0] * local_c8.x[0][0] + local_78.x[0][1] * local_c8.x[0][1];
      dStack_120 = local_78.x[0][2] * local_c8.x[1][2] +
                   local_78.x[0][0] * local_c8.x[1][0] + local_78.x[0][1] * local_c8.x[1][1];
      local_118 = local_78.x[0][2] * local_c8.x[2][2] +
                  local_78.x[0][0] * local_c8.x[2][0] + local_c8.x[2][1] * local_78.x[0][1];
      dVar28 = local_78.x[1][2] * local_c8.x[0][2] +
               local_78.x[1][0] * local_c8.x[0][0] + local_78.x[1][1] * local_c8.x[0][1];
      dVar19 = local_78.x[1][2] * local_c8.x[1][2] +
               local_78.x[1][0] * local_c8.x[1][0] + local_78.x[1][1] * local_c8.x[1][1];
      local_110._8_4_ = SUB84(dVar19,0);
      local_110._0_8_ = dVar28;
      local_110._12_4_ = (int)((ulong)dVar19 >> 0x20);
      local_100 = local_78.x[1][2] * local_c8.x[2][2] +
                  local_78.x[1][0] * local_c8.x[2][0] + local_c8.x[2][1] * local_78.x[1][1];
      local_f8 = local_78.x[2][2] * local_c8.x[0][2] +
                 local_78.x[2][0] * local_c8.x[0][0] + local_78.x[2][1] * local_c8.x[0][1];
      dStack_f0 = local_78.x[2][2] * local_c8.x[1][2] +
                  local_78.x[2][0] * local_c8.x[1][0] + local_78.x[2][1] * local_c8.x[1][1];
      local_e8 = local_78.x[2][2] * local_c8.x[2][2] +
                 local_78.x[2][0] * local_c8.x[2][0] + local_c8.x[2][1] * local_78.x[2][1];
      if (doScale && numPoints != 1) {
        lVar10 = numPoints + (numPoints == 0);
        if (weights == (float *)0x0) {
          pfVar16 = &A->z;
          dVar24 = 0.0;
          dVar25 = 0.0;
          do {
            dVar21 = (double)((Vec3<float> *)(pfVar16 + -2))->x - (double)local_148._0_8_;
            dVar24 = (((double)*pfVar16 - dVar32) * ((double)*pfVar16 - dVar32) +
                     dVar21 * dVar21 +
                     ((double)pfVar16[-1] - (double)local_148._8_8_) *
                     ((double)pfVar16[-1] - (double)local_148._8_8_)) - dVar24;
            dVar21 = dVar25 + dVar24;
            dVar24 = (dVar21 - dVar25) - dVar24;
            pfVar16 = pfVar16 + 3;
            lVar10 = lVar10 + -1;
            dVar25 = dVar21;
          } while (lVar10 != 0);
        }
        else {
          pfVar16 = &A->z;
          lVar13 = 0;
          dVar24 = 0.0;
          dVar25 = 0.0;
          do {
            dVar21 = (double)((Vec3<float> *)(pfVar16 + -2))->x - (double)local_148._0_8_;
            dVar24 = (((double)*pfVar16 - dVar32) * ((double)*pfVar16 - dVar32) +
                     dVar21 * dVar21 +
                     ((double)pfVar16[-1] - (double)local_148._8_8_) *
                     ((double)pfVar16[-1] - (double)local_148._8_8_)) * (double)weights[lVar13] -
                     dVar24;
            dVar21 = dVar25 + dVar24;
            dVar24 = (dVar21 - dVar25) - dVar24;
            lVar13 = lVar13 + 1;
            pfVar16 = pfVar16 + 3;
            dVar25 = dVar21;
          } while (lVar10 != lVar13);
        }
        dVar25 = 0.0;
        pdVar11 = &local_128;
        lVar10 = 0;
        dVar24 = 0.0;
        do {
          lVar13 = 0;
          pdVar14 = pdVar11;
          dVar22 = dVar25;
          do {
            dVar24 = *pdVar14 * (*(double (*) [3])*A_00)[lVar13] - dVar24;
            dVar25 = dVar22 + dVar24;
            dVar24 = (dVar25 - dVar22) - dVar24;
            lVar13 = lVar13 + 1;
            pdVar14 = pdVar14 + 3;
            dVar22 = dVar25;
          } while (lVar13 != 3);
          lVar10 = lVar10 + 1;
          A_00 = A_00 + 1;
          pdVar11 = pdVar11 + 1;
        } while (lVar10 != 3);
        dVar25 = dVar25 / dVar21;
      }
      else {
        dVar25 = 1.0;
      }
      dVar21 = (double)local_148._0_8_ * dVar25;
      dVar24 = (double)local_148._8_8_ * dVar25;
      dVar32 = dVar32 * dVar25;
      __return_storage_ptr__->x[0][0] = local_128 * dVar25;
      __return_storage_ptr__->x[0][1] = dStack_120 * dVar25;
      __return_storage_ptr__->x[0][2] = local_118 * dVar25;
      __return_storage_ptr__->x[0][3] = 0.0;
      auVar7._8_4_ = SUB84(dVar19 * dVar25,0);
      auVar7._0_8_ = dVar28 * dVar25;
      auVar7._12_4_ = (int)((ulong)(dVar19 * dVar25) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[1] = auVar7;
      __return_storage_ptr__->x[1][2] = local_100 * dVar25;
      __return_storage_ptr__->x[1][3] = 0.0;
      auVar6._8_4_ = SUB84(dVar25 * dStack_f0,0);
      auVar6._0_8_ = dVar25 * local_f8;
      auVar6._12_4_ = (int)((ulong)(dVar25 * dStack_f0) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[2] = auVar6;
      __return_storage_ptr__->x[2][2] = local_e8 * dVar25;
      __return_storage_ptr__->x[2][3] = 0.0;
      dVar19 = (double)local_138._8_8_ -
               (dVar32 * dStack_f0 + dVar21 * dStack_120 + dVar24 * dVar19);
      auVar5._8_4_ = SUB84(dVar19,0);
      auVar5._0_8_ = (double)local_138._0_8_ -
                     (dVar32 * local_f8 + dVar21 * local_128 + dVar24 * dVar28);
      auVar5._12_4_ = (int)((ulong)dVar19 >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->x[3] = auVar5;
      __return_storage_ptr__->x[3][2] =
           dVar27 - (dVar32 * local_e8 + dVar21 * local_118 + local_100 * dVar24);
    }
    else {
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
    }
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (
    const Vec3<T>* A,
    const Vec3<T>* B,
    const T*       weights,
    const size_t   numPoints,
    const bool     doScale)
{
    if (numPoints == 0) return M44d ();

    // Always do the accumulation in double precision:
    V3d    Acenter (0.0);
    V3d    Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0) return M44d ();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C +=
                outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d  S;
    jacobiSVD (C, U, S, V, std::numeric_limits<double>::epsilon (), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed ();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2 ();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA +=
                    ((double) weights[i]) * ((V3d) A[i] - Acenter).length2 ();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get () / traceATA.get ();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).
    const V3d translate = Bcenter - s * Acenter * Qt;

    return M44d (
        s * Qt.x[0][0],
        s * Qt.x[0][1],
        s * Qt.x[0][2],
        T (0),
        s * Qt.x[1][0],
        s * Qt.x[1][1],
        s * Qt.x[1][2],
        T (0),
        s * Qt.x[2][0],
        s * Qt.x[2][1],
        s * Qt.x[2][2],
        T (0),
        translate.x,
        translate.y,
        translate.z,
        T (1));
}